

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.h
# Opt level: O0

string_view __thiscall absl::lts_20240722::Status::message(Status *this)

{
  bool bVar1;
  Nonnull<const_status_internal::StatusRep_*> this_00;
  string *this_01;
  string_view sVar2;
  Status *this_local;
  char *local_10;
  
  bVar1 = IsInlined(this->rep_);
  if (bVar1) {
    bVar1 = IsMovedFrom(this->rep_);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                 "Status accessed after move.");
      sVar2._M_str = local_10;
      sVar2._M_len = (size_t)this_local;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      sVar2._M_str = local_10;
      sVar2._M_len = (size_t)this_local;
    }
  }
  else {
    this_00 = RepToPointer(this->rep_);
    this_01 = status_internal::StatusRep::message_abi_cxx11_(this_00);
    sVar2 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01)
    ;
  }
  return sVar2;
}

Assistant:

inline absl::string_view Status::message() const {
  return !IsInlined(rep_)
             ? RepToPointer(rep_)->message()
             : (IsMovedFrom(rep_) ? absl::string_view(kMovedFromString)
                                  : absl::string_view());
}